

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O0

void set_fnumber(EOPLL *opll,int ch,int fnum)

{
  ushort uVar1;
  EOPLL_SLOT *slot;
  EOPLL_SLOT *slot_00;
  EOPLL_SLOT *mod;
  EOPLL_SLOT *car;
  int fnum_local;
  int ch_local;
  EOPLL *opll_local;
  
  slot = opll->slot + (int)(ch << 1 | 1);
  slot_00 = opll->slot + (ch << 1);
  uVar1 = (ushort)fnum;
  slot->fnum = uVar1;
  slot->blk_fnum = slot->blk_fnum & 0xe00 | uVar1 & 0x1ff;
  slot_00->fnum = uVar1;
  slot_00->blk_fnum = slot_00->blk_fnum & 0xe00 | uVar1 & 0x1ff;
  request_update(slot,0xe);
  request_update(slot_00,0xe);
  return;
}

Assistant:

static INLINE void set_fnumber(EOPLL *opll, int ch, int fnum) {
  EOPLL_SLOT *car = CAR(opll, ch);
  EOPLL_SLOT *mod = MOD(opll, ch);
  car->fnum = fnum;
  car->blk_fnum = (car->blk_fnum & 0xe00) | (fnum & 0x1ff);
  mod->fnum = fnum;
  mod->blk_fnum = (mod->blk_fnum & 0xe00) | (fnum & 0x1ff);
  request_update(car, UPDATE_EG | UPDATE_RKS | UPDATE_TLL);
  request_update(mod, UPDATE_EG | UPDATE_RKS | UPDATE_TLL);
}